

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ImFontGlyph *pIVar4;
  ImFontConfig *pIVar5;
  ImFontGlyph *__dest;
  uint uVar6;
  float fVar7;
  
  iVar2 = (this->Glyphs).Size;
  iVar3 = (this->Glyphs).Capacity;
  uVar1 = iVar2 + 1;
  if (iVar3 <= iVar2) {
    if (iVar3 == 0) {
      uVar6 = 8;
    }
    else {
      uVar6 = iVar3 / 2 + iVar3;
    }
    if ((int)uVar6 <= (int)uVar1) {
      uVar6 = uVar1;
    }
    if (iVar3 < (int)uVar6) {
      __dest = (ImFontGlyph *)ImGui::MemAlloc((long)(int)uVar6 * 0x28);
      pIVar4 = (this->Glyphs).Data;
      if (pIVar4 != (ImFontGlyph *)0x0) {
        memcpy(__dest,pIVar4,(long)(this->Glyphs).Size * 0x28);
        ImGui::MemFree((this->Glyphs).Data);
      }
      (this->Glyphs).Data = __dest;
      (this->Glyphs).Capacity = uVar6;
    }
  }
  (this->Glyphs).Size = uVar1;
  if (-1 < iVar2) {
    pIVar4 = (this->Glyphs).Data;
    *(uint *)(pIVar4 + ((ulong)uVar1 - 1)) =
         (uint)(x0 != x1 && y0 != y1) * -0x80000000 | (uint)codepoint;
    pIVar4[(ulong)uVar1 - 1].X0 = x0;
    pIVar4[(ulong)uVar1 - 1].Y0 = y0;
    pIVar4[(ulong)uVar1 - 1].X1 = x1;
    pIVar4[(ulong)uVar1 - 1].Y1 = y1;
    pIVar4[(ulong)uVar1 - 1].U0 = u0;
    pIVar4[(ulong)uVar1 - 1].V0 = v0;
    pIVar4[(ulong)uVar1 - 1].U1 = u1;
    pIVar4[(ulong)uVar1 - 1].V1 = v1;
    pIVar5 = this->ConfigData;
    fVar7 = advance_x + (pIVar5->GlyphExtraSpacing).x;
    pIVar4[(ulong)uVar1 - 1].AdvanceX = fVar7;
    if (pIVar5->PixelSnapH == true) {
      pIVar4[(ulong)uVar1 - 1].AdvanceX = (float)(int)(fVar7 + 0.5);
    }
    this->DirtyLookupTables = true;
    this->MetricsTotalSurface =
         this->MetricsTotalSurface +
         (int)((float)this->ContainerAtlas->TexHeight * (v1 - v0) + 1.99) *
         (int)((float)this->ContainerAtlas->TexWidth * (u1 - u0) + 1.99);
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                ,0x538,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = IM_ROUND(glyph.AdvanceX);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}